

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property::parse_string(property *this,text_input_buffer *input)

{
  char cVar1;
  allocator<char> local_f9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  string local_e8 [38];
  char local_c2;
  byte local_c1;
  undefined1 local_c0 [6];
  char c;
  bool isEscaped;
  vector<char,_std::allocator<char>_> bytes;
  string local_98;
  undefined1 local_78 [8];
  property_value v;
  text_input_buffer *input_local;
  property *this_local;
  
  v._88_8_ = input;
  std::__cxx11::string::string((string *)&local_98);
  property_value::property_value((property_value *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  cVar1 = text_input_buffer::operator*((text_input_buffer *)v._88_8_);
  if (cVar1 != '\"') {
    __assert_fail("*input == \'\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x105,"void dtc::fdt::property::parse_string(text_input_buffer &)");
  }
  text_input_buffer::operator++((text_input_buffer *)v._88_8_);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_c0);
  local_c1 = 0;
  do {
    local_c2 = text_input_buffer::operator*((text_input_buffer *)v._88_8_);
    if (local_c2 == '\0') {
LAB_0018038f:
      local_f0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_c0);
      local_f8._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)local_c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_e8,local_f0,local_f8,&local_f9);
      std::__cxx11::string::operator=((string *)(v.label.field_2._M_local_buf + 8),local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_f9);
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,(value_type *)local_78);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_c0);
      property_value::~property_value((property_value *)local_78);
      return;
    }
    if ((local_c2 == '\"') && ((local_c1 & 1) == 0)) {
      text_input_buffer::consume((text_input_buffer *)v._88_8_,'\"');
      goto LAB_0018038f;
    }
    local_c1 = local_c2 == '\\';
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)local_c0,&local_c2);
    text_input_buffer::operator++((text_input_buffer *)v._88_8_);
  } while( true );
}

Assistant:

void
property::parse_string(text_input_buffer &input)
{
	property_value v;
	assert(*input == '"');
	++input;
	std::vector<char> bytes;
	bool isEscaped = false;
	while (char c = *input)
	{
		if (c == '"' && !isEscaped)
		{
			input.consume('"');
			break;
		}
		isEscaped = (c == '\\');
		bytes.push_back(c);
		++input;
	}
	v.string_data = string(bytes.begin(), bytes.end());
	values.push_back(v);
}